

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void tdefl_huffman_enforce_max_code_size(int *pNum_codes,int code_list_len,int max_code_size)

{
  int iVar1;
  uint local_20;
  int local_1c;
  mz_uint32 total;
  int i;
  int max_code_size_local;
  int code_list_len_local;
  int *pNum_codes_local;
  
  local_20 = 0;
  if (1 < code_list_len) {
    for (local_1c = max_code_size + 1; iVar1 = max_code_size, local_1c < 0x21;
        local_1c = local_1c + 1) {
      pNum_codes[max_code_size] = pNum_codes[local_1c] + pNum_codes[max_code_size];
    }
    while (local_1c = iVar1, 0 < local_1c) {
      local_20 = (pNum_codes[local_1c] << ((byte)max_code_size - (char)local_1c & 0x1f)) + local_20;
      iVar1 = local_1c + -1;
    }
    for (; (ulong)local_20 != 1L << ((byte)max_code_size & 0x3f); local_20 = local_20 - 1) {
      pNum_codes[max_code_size] = pNum_codes[max_code_size] + -1;
      for (local_1c = max_code_size + -1; 0 < local_1c; local_1c = local_1c + -1) {
        if (pNum_codes[local_1c] != 0) {
          pNum_codes[local_1c] = pNum_codes[local_1c] + -1;
          pNum_codes[local_1c + 1] = pNum_codes[local_1c + 1] + 2;
          break;
        }
      }
    }
  }
  return;
}

Assistant:

static void tdefl_huffman_enforce_max_code_size(int *pNum_codes,
                                                int code_list_len,
                                                int max_code_size) {
  int i;
  mz_uint32 total = 0;
  if (code_list_len <= 1)
    return;
  for (i = max_code_size + 1; i <= TDEFL_MAX_SUPPORTED_HUFF_CODESIZE; i++)
    pNum_codes[max_code_size] += pNum_codes[i];
  for (i = max_code_size; i > 0; i--)
    total += (((mz_uint32)pNum_codes[i]) << (max_code_size - i));
  while (total != (1UL << max_code_size)) {
    pNum_codes[max_code_size]--;
    for (i = max_code_size - 1; i > 0; i--)
      if (pNum_codes[i]) {
        pNum_codes[i]--;
        pNum_codes[i + 1] += 2;
        break;
      }
    total--;
  }
}